

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
CoreML::FeatureType::toDictionary_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,FeatureType *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  bool bVar7;
  uint uVar8;
  mapped_type *pmVar9;
  DictionaryFeatureType *pDVar10;
  SequenceFeatureType *pSVar11;
  SizeRange *pSVar12;
  ImageFeatureType *params;
  ArrayFeatureType *params_00;
  Type *pTVar13;
  ArrayFeatureType_EnumeratedShapes *pAVar14;
  Type *pTVar15;
  long *plVar16;
  Type *pTVar17;
  ImageFeatureType_EnumeratedImageSizes *pIVar18;
  ImageFeatureType_ImageSizeRange *pIVar19;
  char useArrayFormat;
  ulong uVar20;
  TypeCase in_EDX;
  KeyTypeCase extraout_EDX;
  KeyTypeCase extraout_EDX_00;
  KeyTypeCase extraout_EDX_01;
  KeyTypeCase tag;
  KeyTypeCase extraout_EDX_02;
  KeyTypeCase extraout_EDX_03;
  ImageFeatureType_ColorSpace extraout_EDX_04;
  ImageFeatureType_ColorSpace extraout_EDX_05;
  ImageFeatureType_ColorSpace extraout_EDX_06;
  ImageFeatureType_ColorSpace colorspace;
  int d;
  int index;
  char *pcVar21;
  ulong uVar22;
  int i;
  int iVar23;
  ulong uVar24;
  _Alloc_hider _Var25;
  undefined1 uVar26;
  uint uVar27;
  char *pcVar28;
  string __str;
  vector<long,_std::allocator<long>_> defaultSize;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> ranges;
  string local_b8;
  key_type local_90;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_70;
  vector<long,_std::allocator<long>_> local_68;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_48;
  
  uVar27 = ((this->m_type).
            super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->_oneof_case_[0];
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70 = __return_storage_ptr__;
  featureTypeToString_abi_cxx11_(&local_b8,(CoreML *)(ulong)uVar27,in_EDX);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"type","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_70,&local_90);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  pcVar28 = "0";
  pcVar21 = "0";
  if (((this->m_type).
       super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      isoptional_ != false) {
    pcVar21 = "1";
  }
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"isOptional","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_70,&local_b8);
  uVar26 = 1;
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,(ulong)pcVar21);
  tag = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    tag = extraout_EDX_00;
  }
  if (3 < uVar27 - 4) {
    return local_70;
  }
  useArrayFormat = (char)(&switchD_0027f0ea::switchdataD_00358ce8)[uVar27 - 4] + -0x18;
  switch(uVar27) {
  case 4:
    peVar3 = (this->m_type).
             super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar3->_oneof_case_[0] == 4) {
      params = (peVar3->Type_).imagetype_;
    }
    else {
      params = Specification::ImageFeatureType::default_instance();
    }
    defaultSizeOf(&local_68,params);
    uVar24 = *local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar22 = -uVar24;
    if (0 < (long)uVar24) {
      uVar22 = uVar24;
    }
    uVar27 = 1;
    if (9 < uVar22) {
      uVar20 = uVar22;
      uVar8 = 4;
      do {
        uVar27 = uVar8;
        if (uVar20 < 100) {
          uVar27 = uVar27 - 2;
          goto LAB_0027f863;
        }
        if (uVar20 < 1000) {
          uVar27 = uVar27 - 1;
          goto LAB_0027f863;
        }
        if (uVar20 < 10000) goto LAB_0027f863;
        bVar7 = 99999 < uVar20;
        uVar20 = uVar20 / 10000;
        uVar8 = uVar27 + 4;
      } while (bVar7);
      uVar27 = uVar27 + 1;
    }
LAB_0027f863:
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar27 - (char)((long)uVar24 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_b8._M_dataplus._M_p + -((long)uVar24 >> 0x3f),uVar27,uVar22);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"width","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    uVar24 = local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[1];
    uVar22 = -uVar24;
    if (0 < (long)uVar24) {
      uVar22 = uVar24;
    }
    uVar27 = 1;
    if (9 < uVar22) {
      uVar20 = uVar22;
      uVar8 = 4;
      do {
        uVar27 = uVar8;
        if (uVar20 < 100) {
          uVar27 = uVar27 - 2;
          goto LAB_0027f971;
        }
        if (uVar20 < 1000) {
          uVar27 = uVar27 - 1;
          goto LAB_0027f971;
        }
        if (uVar20 < 10000) goto LAB_0027f971;
        bVar7 = 99999 < uVar20;
        uVar20 = uVar20 / 10000;
        uVar8 = uVar27 + 4;
      } while (bVar7);
      uVar27 = uVar27 + 1;
    }
LAB_0027f971:
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar27 - (char)((long)uVar24 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_b8._M_dataplus._M_p + -((long)uVar24 >> 0x3f),uVar27,uVar22);
    paVar2 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"height","");
    paVar4 = &local_b8.field_2;
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_b8);
    colorspace = extraout_EDX_04;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      colorspace = extraout_EDX_05;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar4) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      colorspace = extraout_EDX_06;
    }
    colorSpaceToString_abi_cxx11_(&local_b8,(CoreML *)(ulong)(uint)params->colorspace_,colorspace);
    local_90._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"colorspace","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar4) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    pcVar21 = "0";
    if (params->colorspace_ != 0x28) {
      pcVar21 = "1";
    }
    if (params->colorspace_ == 10) {
      pcVar21 = "0";
    }
    local_b8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"isColor","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_b8);
    std::__cxx11::string::_M_replace
              ((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,(ulong)pcVar21);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar4) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (params->_oneof_case_[0] != 0) {
      pcVar28 = "1";
    }
    local_b8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"hasSizeFlexibility","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_b8);
    std::__cxx11::string::_M_replace
              ((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,(ulong)pcVar28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar4) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    uVar26 = SUB81(pcVar28,0);
    if (params->_oneof_case_[0] == 0x15) {
      local_48.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar23 = 0;
      while( true ) {
        if (params->_oneof_case_[0] == 0x15) {
          pIVar18 = (params->SizeFlexibility_).enumeratedsizes_;
        }
        else {
          pIVar18 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
        }
        uVar26 = SUB81(pcVar28,0);
        if ((pIVar18->sizes_).super_RepeatedPtrFieldBase.current_size_ <= iVar23) break;
        local_b8._M_dataplus._M_p = (pointer)0x0;
        local_b8._M_string_length = 0;
        local_b8.field_2._M_allocated_capacity = 0;
        if (params->_oneof_case_[0] == 0x15) {
          pIVar18 = (params->SizeFlexibility_).enumeratedsizes_;
        }
        else {
          pIVar18 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
        }
        pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                            (&(pIVar18->sizes_).super_RepeatedPtrFieldBase,iVar23);
        local_90._M_dataplus._M_p = (pointer)pTVar17->width_;
        if (local_b8._M_string_length == local_b8.field_2._M_allocated_capacity) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    ((vector<long,_std::allocator<long>_> *)&local_b8,
                     (iterator)local_b8._M_string_length,(long *)&local_90);
        }
        else {
          *(pointer *)local_b8._M_string_length = local_90._M_dataplus._M_p;
          local_b8._M_string_length = local_b8._M_string_length + 8;
        }
        if (params->_oneof_case_[0] == 0x15) {
          pIVar18 = (params->SizeFlexibility_).enumeratedsizes_;
        }
        else {
          pIVar18 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
        }
        pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                            (&(pIVar18->sizes_).super_RepeatedPtrFieldBase,iVar23);
        local_90._M_dataplus._M_p = (pointer)pTVar17->height_;
        if (local_b8._M_string_length == local_b8.field_2._M_allocated_capacity) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    ((vector<long,_std::allocator<long>_> *)&local_b8,
                     (iterator)local_b8._M_string_length,(long *)&local_90);
        }
        else {
          *(pointer *)local_b8._M_string_length = local_90._M_dataplus._M_p;
          local_b8._M_string_length = local_b8._M_string_length + 8;
        }
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::push_back(&local_48,(value_type *)&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_b8._M_dataplus._M_p,
                          local_b8.field_2._M_allocated_capacity - (long)local_b8._M_dataplus._M_p);
        }
        iVar23 = iVar23 + 1;
      }
      enumeratedShapesToString_abi_cxx11_
                (&local_b8,(CoreML *)&local_48,
                 (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)0x1,(bool)uVar26);
      paVar2 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"enumeratedSizes","");
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_70,&local_90);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      enumeratedShapesToString_abi_cxx11_
                (&local_b8,(CoreML *)&local_48,
                 (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)0x0,(bool)uVar26);
      local_90._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"sizeFlexibility","");
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_70,&local_90);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector(&local_48);
    }
    else if (params->_oneof_case_[0] == 0x1f) {
      local_48.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pSVar12 = ((params->SizeFlexibility_).imagesizerange_)->widthrange_;
      if (pSVar12 == (SizeRange *)0x0) {
        pSVar12 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      pcVar5 = (pointer)pSVar12->lowerbound_;
      if (params->_oneof_case_[0] == 0x1f) {
        pIVar19 = (params->SizeFlexibility_).imagesizerange_;
      }
      else {
        pIVar19 = Specification::ImageFeatureType_ImageSizeRange::default_instance();
      }
      pSVar12 = pIVar19->widthrange_;
      if (pSVar12 == (SizeRange *)0x0) {
        pSVar12 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      local_b8._M_string_length = pSVar12->upperbound_;
      local_b8._M_dataplus._M_p = pcVar5;
      if (local_48.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_48.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
        _M_realloc_insert<std::pair<long,long>>
                  ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&local_48,
                   (iterator)
                   local_48.
                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(pair<long,_long> *)&local_b8);
      }
      else {
        *(pointer *)
         &(local_48.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->
          super__Vector_base<long,_std::allocator<long>_> = pcVar5;
        *(size_type *)
         ((long)local_48.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) = local_b8._M_string_length;
        local_48.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_48.
                             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 0x10);
      }
      if (params->_oneof_case_[0] == 0x1f) {
        pIVar19 = (params->SizeFlexibility_).imagesizerange_;
      }
      else {
        pIVar19 = Specification::ImageFeatureType_ImageSizeRange::default_instance();
      }
      pSVar12 = pIVar19->heightrange_;
      if (pSVar12 == (SizeRange *)0x0) {
        pSVar12 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pSVar12->lowerbound_;
      if (params->_oneof_case_[0] == 0x1f) {
        pIVar19 = (params->SizeFlexibility_).imagesizerange_;
      }
      else {
        pIVar19 = Specification::ImageFeatureType_ImageSizeRange::default_instance();
      }
      pSVar12 = pIVar19->heightrange_;
      if (pSVar12 == (SizeRange *)0x0) {
        pSVar12 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      local_b8._M_string_length = pSVar12->upperbound_;
      local_b8._M_dataplus._M_p = (pointer)paVar6;
      if (local_48.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_48.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
        _M_realloc_insert<std::pair<long,long>>
                  ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&local_48,
                   (iterator)
                   local_48.
                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(pair<long,_long> *)&local_b8);
      }
      else {
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&(local_48.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super__Vector_base<long,_std::allocator<long>_> = paVar6;
        *(size_type *)
         ((long)local_48.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) = local_b8._M_string_length;
        local_48.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_48.
                             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 0x10);
      }
      dimensionRangesToString_abi_cxx11_
                (&local_b8,(CoreML *)&local_48,
                 (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x1,
                 (bool)uVar26);
      local_90._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"sizeRange","");
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_70,&local_90);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar4) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      dimensionRangesToString_abi_cxx11_
                (&local_b8,(CoreML *)&local_48,
                 (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x0,
                 (bool)uVar26);
      local_90._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"sizeFlexibility","");
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_70,&local_90);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar4) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        uVar24 = (long)local_48.
                       super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                 (long)local_48.
                       super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        _Var25._M_p = (pointer)local_48.
                               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_0027ff65;
      }
    }
    break;
  case 5:
    peVar3 = (this->m_type).
             super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar3->_oneof_case_[0] == 5) {
      params_00 = (peVar3->Type_).multiarraytype_;
    }
    else {
      params_00 = Specification::ArrayFeatureType::default_instance();
      tag = extraout_EDX_03;
    }
    dataTypeToString_abi_cxx11_(&local_b8,(CoreML *)(ulong)(uint)params_00->datatype_,tag);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"dataType","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    defaultShapeOf(&local_68,params_00);
    dimensionsToString_abi_cxx11_
              (&local_b8,(CoreML *)&local_68,(vector<long,_std::allocator<long>_> *)0x1,
               (bool)useArrayFormat);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"shape","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (params_00->_oneof_case_[0] != 0) {
      pcVar28 = "1";
    }
    local_b8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"hasShapeFlexibility","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_b8);
    std::__cxx11::string::_M_replace
              ((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,(ulong)pcVar28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (params_00->_oneof_case_[0] == 0x15) {
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      iVar23 = 0;
      while( true ) {
        if (params_00->_oneof_case_[0] == 0x15) {
          pAVar14 = (params_00->ShapeFlexibility_).enumeratedshapes_;
        }
        else {
          pAVar14 = Specification::ArrayFeatureType_EnumeratedShapes::default_instance();
        }
        uVar26 = SUB81(pcVar28,0);
        if ((pAVar14->shapes_).super_RepeatedPtrFieldBase.current_size_ <= iVar23) break;
        local_b8._M_dataplus._M_p = (pointer)0x0;
        local_b8._M_string_length = 0;
        local_b8.field_2._M_allocated_capacity = 0;
        index = 0;
        while( true ) {
          if (params_00->_oneof_case_[0] == 0x15) {
            pAVar14 = (params_00->ShapeFlexibility_).enumeratedshapes_;
          }
          else {
            pAVar14 = Specification::ArrayFeatureType_EnumeratedShapes::default_instance();
          }
          pTVar15 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::TypeHandler>
                              (&(pAVar14->shapes_).super_RepeatedPtrFieldBase,iVar23);
          if ((pTVar15->shape_).current_size_ <= index) break;
          if (params_00->_oneof_case_[0] == 0x15) {
            pAVar14 = (params_00->ShapeFlexibility_).enumeratedshapes_;
          }
          else {
            pAVar14 = Specification::ArrayFeatureType_EnumeratedShapes::default_instance();
          }
          pTVar15 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::TypeHandler>
                              (&(pAVar14->shapes_).super_RepeatedPtrFieldBase,iVar23);
          plVar16 = google::protobuf::RepeatedField<long>::Get(&pTVar15->shape_,index);
          local_90._M_dataplus._M_p = (pointer)*plVar16;
          if (local_b8._M_string_length == local_b8.field_2._M_allocated_capacity) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      ((vector<long,_std::allocator<long>_> *)&local_b8,
                       (iterator)local_b8._M_string_length,(long *)&local_90);
          }
          else {
            *(pointer *)local_b8._M_string_length = local_90._M_dataplus._M_p;
            local_b8._M_string_length = local_b8._M_string_length + 8;
          }
          index = index + 1;
        }
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::push_back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     *)&local_68,(value_type *)&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_b8._M_dataplus._M_p,
                          local_b8.field_2._M_allocated_capacity - (long)local_b8._M_dataplus._M_p);
        }
        iVar23 = iVar23 + 1;
      }
      enumeratedShapesToString_abi_cxx11_
                (&local_b8,(CoreML *)&local_68,
                 (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)0x1,(bool)uVar26);
      paVar2 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"enumeratedShapes","");
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_70,&local_90);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      enumeratedShapesToString_abi_cxx11_
                (&local_b8,(CoreML *)&local_68,
                 (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)0x0,(bool)uVar26);
      local_90._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"shapeFlexibility","");
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_70,&local_90);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)&local_68);
      return local_70;
    }
    if (params_00->_oneof_case_[0] != 0x1f) {
      return local_70;
    }
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    iVar23 = 0;
    while( true ) {
      if (params_00->_oneof_case_[0] == 0x1f) {
        pAVar14 = (params_00->ShapeFlexibility_).enumeratedshapes_;
      }
      else {
        pAVar14 = (ArrayFeatureType_EnumeratedShapes *)
                  Specification::ArrayFeatureType_ShapeRange::default_instance();
      }
      uVar26 = SUB81(pcVar28,0);
      if ((((RepeatedPtrField<CoreML::Specification::SizeRange> *)&pAVar14->shapes_)->
          super_RepeatedPtrFieldBase).current_size_ <= iVar23) break;
      if (params_00->_oneof_case_[0] == 0x1f) {
        pAVar14 = (params_00->ShapeFlexibility_).enumeratedshapes_;
      }
      else {
        pAVar14 = (ArrayFeatureType_EnumeratedShapes *)
                  Specification::ArrayFeatureType_ShapeRange::default_instance();
      }
      pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                          ((RepeatedPtrFieldBase *)&pAVar14->shapes_,iVar23);
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pTVar13->lowerbound_;
      if (params_00->_oneof_case_[0] == 0x1f) {
        pAVar14 = (params_00->ShapeFlexibility_).enumeratedshapes_;
      }
      else {
        pAVar14 = (ArrayFeatureType_EnumeratedShapes *)
                  Specification::ArrayFeatureType_ShapeRange::default_instance();
      }
      pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                          ((RepeatedPtrFieldBase *)&pAVar14->shapes_,iVar23);
      local_b8._M_string_length = pTVar13->upperbound_;
      local_b8._M_dataplus._M_p = (pointer)paVar4;
      if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
        _M_realloc_insert<std::pair<long,long>>
                  ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&local_68,
                   (iterator)
                   local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(pair<long,_long> *)&local_b8);
      }
      else {
        *local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = (long)paVar4;
        *(size_type *)
         ((long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish + 8) = local_b8._M_string_length;
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                    .super__Vector_impl_data._M_finish + 0x10);
      }
      iVar23 = iVar23 + 1;
    }
    dimensionRangesToString_abi_cxx11_
              (&local_b8,(CoreML *)&local_68,
               (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x1,
               (bool)uVar26);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"shapeRange","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    dimensionRangesToString_abi_cxx11_
              (&local_b8,(CoreML *)&local_68,
               (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x0,
               (bool)uVar26);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"shapeFlexibility","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      uVar24 = local_b8.field_2._M_allocated_capacity + 1;
      _Var25._M_p = local_b8._M_dataplus._M_p;
LAB_0027ff65:
      operator_delete(_Var25._M_p,uVar24);
    }
    break;
  case 6:
    peVar3 = (this->m_type).
             super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar3->_oneof_case_[0] == 6) {
      pDVar10 = (peVar3->Type_).dictionarytype_;
    }
    else {
      pDVar10 = Specification::DictionaryFeatureType::default_instance();
      tag = extraout_EDX_01;
    }
    keyTypeToString_abi_cxx11_(&local_b8,(CoreML *)(ulong)pDVar10->_oneof_case_[0],tag);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"keyType","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
    goto LAB_0027f24d;
  case 7:
    peVar3 = (this->m_type).
             super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar3->_oneof_case_[0] == 7) {
      pSVar11 = (peVar3->Type_).sequencetype_;
    }
    else {
      pSVar11 = Specification::SequenceFeatureType::default_instance();
      tag = extraout_EDX_02;
    }
    sequenceTypeToString_abi_cxx11_(&local_b8,(CoreML *)(ulong)pSVar11->_oneof_case_[0],tag);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"valueType","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    pSVar12 = pSVar11->sizerange_;
    if (pSVar12 == (SizeRange *)0x0) {
      pSVar12 = (SizeRange *)&Specification::_SizeRange_default_instance_;
    }
    rangeToString_abi_cxx11_
              (&local_b8,(CoreML *)pSVar12->lowerbound_,pSVar12->upperbound_,1,(bool)uVar26);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"sizeRange","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_70,&local_90);
LAB_0027f24d:
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == paVar2) {
      return local_70;
    }
    uVar24 = local_b8.field_2._M_allocated_capacity + 1;
    _Var25._M_p = local_b8._M_dataplus._M_p;
    goto LAB_0027ff7c;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    uVar24 = (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
             (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
    _Var25._M_p = (pointer)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start;
LAB_0027ff7c:
    operator_delete(_Var25._M_p,uVar24);
  }
  return local_70;
}

Assistant:

std::map<std::string,std::string> FeatureType::toDictionary() const {
        Specification::FeatureType::TypeCase tag = m_type->Type_case();

        std::map<std::string, std::string> dict;
        dict["type"] = featureTypeToString(tag);
        dict["isOptional"] = m_type->isoptional() ? "1" : "0";

        switch (tag) {
            case Specification::FeatureType::kMultiArrayType:
            {
                const Specification::ArrayFeatureType& params = m_type->multiarraytype();
                dict["dataType"] = dataTypeToString(params.datatype());
                dict["shape"] = dimensionsToString(defaultShapeOf(params),true);
                dict["hasShapeFlexibility"] = params.ShapeFlexibility_case() != Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET ? "1" : "0";
                switch (params.ShapeFlexibility_case()) {
                    case Specification::ArrayFeatureType::kEnumeratedShapes: {
                        std::vector<std::vector<int64_t>> shapes = enumeratedShapesOf(params);
                        dict["enumeratedShapes"] = enumeratedShapesToString(shapes,true);
                        dict["shapeFlexibility"] = enumeratedShapesToString(shapes,false);
                        break;
                    }
                    case Specification::ArrayFeatureType::kShapeRange: {
                        std::vector<std::pair<int64_t,int64_t>> ranges = shapeRangesOf(params);
                        dict["shapeRange"] = dimensionRangesToString(ranges,true);
                        dict["shapeFlexibility"] = dimensionRangesToString(ranges,false);
                        break;
                    }
                    case Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                        break;
                }
                break;
            }
            case Specification::FeatureType::kDictionaryType:
            {
                dict["keyType"] = keyTypeToString(m_type->dictionarytype().KeyType_case());
                break;
            }
            case Specification::FeatureType::kImageType:
            {
                const Specification::ImageFeatureType& params = m_type->imagetype();
                auto defaultSize = defaultSizeOf(params);
                dict["width"] = std::to_string(defaultSize[0]);
                dict["height"] = std::to_string(defaultSize[1]);
                dict["colorspace"] = colorSpaceToString(params.colorspace());
                dict["isColor"] = (params.colorspace() == Specification::ImageFeatureType_ColorSpace_GRAYSCALE ||
                                   params.colorspace() == Specification::ImageFeatureType_ColorSpace_GRAYSCALE_FLOAT16) ? "0" : "1";
                dict["hasSizeFlexibility"] = params.SizeFlexibility_case() != Specification::ImageFeatureType::SIZEFLEXIBILITY_NOT_SET ? "1" : "0";
                switch (params.SizeFlexibility_case()) {
                    case Specification::ImageFeatureType::kEnumeratedSizes: {
                        std::vector<std::vector<int64_t>> shapes = enumeratedSizesOf(params);
                        dict["enumeratedSizes"] = enumeratedShapesToString(shapes,true);
                        dict["sizeFlexibility"] = enumeratedShapesToString(shapes,false);
                        break;
                    }
                    case Specification::ImageFeatureType::kImageSizeRange: {
                        std::vector<std::pair<int64_t,int64_t>> ranges = sizeRangesOf(params);
                        dict["sizeRange"] = dimensionRangesToString(ranges,true);
                        dict["sizeFlexibility"] = dimensionRangesToString(ranges,false);
                        break;
                    }
                    case Specification::ImageFeatureType::SIZEFLEXIBILITY_NOT_SET:
                        break;
                }
                break;
            }
            case Specification::FeatureType::kSequenceType:
            {
                const Specification::SequenceFeatureType& params = m_type->sequencetype();
                dict["valueType"] = sequenceTypeToString(params.Type_case());
                dict["sizeRange"] = rangeToString((int64_t)params.sizerange().lowerbound(), params.sizerange().upperbound(),true);
                break;
            }
            default:
                break;
        }

        return dict;
    }